

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O2

uint128 CityHash128(char *s,size_t len)

{
  uint128 uVar1;
  uint128 seed;
  uint128 seed_00;
  
  if (0xf < len) {
    seed.first = *(ulong *)s ^ 0xc949d7c7509e6557;
    seed.second = *(unsigned_long *)(s + 8);
    uVar1 = CityHash128WithSeed(s + 0x10,len - 0x10,seed);
    return uVar1;
  }
  if (7 < len) {
    seed_00.first = len * -0x3c5a37a36834ced9 ^ *(ulong *)s;
    seed_00.second = *(ulong *)(s + (len - 8)) ^ 0xb492b66fbe98f273;
    uVar1 = CityHash128WithSeed((char *)0x0,0,seed_00);
    return uVar1;
  }
  uVar1.second = 0xb492b66fbe98f273;
  uVar1.first = 0xc3a5c85c97cb3127;
  uVar1 = CityHash128WithSeed(s,len,uVar1);
  return uVar1;
}

Assistant:

uint128 CityHash128(const char *s, size_t len) {
  if (len >= 16) {
    return CityHash128WithSeed(s + 16,
                               len - 16,
                               uint128(Fetch64(s) ^ k3,
                                       Fetch64(s + 8)));
  } else if (len >= 8) {
    return CityHash128WithSeed(NULL,
                               0,
                               uint128(Fetch64(s) ^ (len * k0),
                                       Fetch64(s + len - 8) ^ k1));
  } else {
    return CityHash128WithSeed(s, len, uint128(k0, k1));
  }
}